

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O0

void do_write(uv_tcp_t *handle)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint local_24;
  int r;
  uint i;
  uv_buf_t buf;
  uv_tcp_t *handle_local;
  
  buf.len = (size_t)handle;
  auVar2 = uv_buf_init("PING",4);
  local_24 = 0;
  while( true ) {
    buf.base = auVar2._8_8_;
    _r = auVar2._0_8_;
    if (3 < local_24) {
      return;
    }
    iVar1 = uv_write(write_reqs + local_24,buf.len,&r,1,write_cb);
    auVar2._8_8_ = buf.base;
    auVar2._0_8_ = _r;
    if (iVar1 != 0) break;
    local_24 = local_24 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-reset.c"
          ,0x3b,"r == 0");
  abort();
}

Assistant:

static void do_write(uv_tcp_t* handle) {
  uv_buf_t buf;
  unsigned i;
  int r;

  buf = uv_buf_init("PING", 4);
  for (i = 0; i < ARRAY_SIZE(write_reqs); i++) {
    r = uv_write(&write_reqs[i], (uv_stream_t*) handle, &buf, 1, write_cb);
    ASSERT(r == 0);
  }
}